

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O0

void tool_help(char *category)

{
  int iVar1;
  char *category_note;
  char *category_local;
  
  puts("Usage: curl [options...] <url>");
  if (category == (char *)0x0) {
    print_category(0x200);
    puts(
        "\nThis is not the full help, this menu is stripped into categories.\nUse \"--help category\" to get an overview of all categories.\nFor all options use the manual or \"--help all\"."
        );
  }
  else {
    iVar1 = curl_strequal(category,"all");
    if (iVar1 == 0) {
      iVar1 = curl_strequal(category,"category");
      if (iVar1 == 0) {
        iVar1 = get_category_content(category);
        if (iVar1 != 0) {
          puts("Invalid category provided, here is a list of all categories:\n");
          get_categories();
        }
      }
      else {
        get_categories();
      }
    }
    else {
      print_category(0xfffffffe);
    }
  }
  free(category);
  return;
}

Assistant:

void tool_help(char *category)
{
  puts("Usage: curl [options...] <url>");
  /* If no category was provided */
  if(!category) {
    const char *category_note = "\nThis is not the full help, this "
      "menu is stripped into categories.\nUse \"--help category\" to get "
      "an overview of all categories.\nFor all options use the manual"
      " or \"--help all\".";
    print_category(CURLHELP_IMPORTANT);
    puts(category_note);
  }
  /* Lets print everything if "all" was provided */
  else if(curl_strequal(category, "all"))
    /* Print everything except hidden */
    print_category(~(CURLHELP_HIDDEN));
  /* Lets handle the string "category" differently to not print an errormsg */
  else if(curl_strequal(category, "category"))
    get_categories();
  /* Otherwise print category and handle the case if the cat was not found */
  else if(get_category_content(category)) {
    puts("Invalid category provided, here is a list of all categories:\n");
    get_categories();
  }
  free(category);
}